

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

CompilerGLSL * __thiscall
spirv_cross::CompilerGLSL::builtin_to_glsl_abi_cxx11_
          (CompilerGLSL *this,BuiltIn builtin,StorageClass storage)

{
  bool bVar1;
  SPIREntryPoint *pSVar2;
  char *pcVar3;
  CompilerError *pCVar4;
  int in_ECX;
  undefined4 in_register_00000034;
  CompilerGLSL *this_00;
  spirv_cross local_738 [33];
  allocator local_717;
  allocator local_716;
  allocator local_715;
  allocator local_714;
  allocator local_713;
  undefined1 local_712;
  allocator local_711;
  string local_710 [39];
  allocator local_6e9;
  string local_6e8 [38];
  allocator local_6c2;
  allocator local_6c1;
  string local_6c0 [38];
  undefined1 local_69a;
  allocator local_699;
  string local_698 [38];
  allocator local_672;
  allocator local_671;
  string local_670 [38];
  undefined1 local_64a;
  allocator local_649;
  string local_648 [38];
  allocator local_622;
  allocator local_621;
  string local_620 [38];
  undefined1 local_5fa;
  allocator local_5f9;
  string local_5f8 [38];
  undefined1 local_5d2;
  allocator local_5d1;
  string local_5d0 [38];
  allocator local_5aa;
  allocator local_5a9;
  string local_5a8 [38];
  allocator local_582;
  allocator local_581;
  string local_580 [38];
  allocator local_55a;
  allocator local_559;
  string local_558 [38];
  undefined1 local_532;
  allocator local_531;
  string local_530 [38];
  undefined1 local_50a;
  allocator local_509;
  string local_508 [38];
  allocator local_4e2;
  allocator local_4e1;
  string local_4e0 [38];
  allocator local_4ba;
  allocator local_4b9;
  string local_4b8 [38];
  undefined1 local_492;
  allocator local_491;
  string local_490 [38];
  undefined1 local_46a;
  allocator local_469;
  string local_468 [37];
  allocator local_443;
  allocator local_442;
  allocator local_441;
  allocator local_440;
  allocator local_43f;
  allocator local_43e;
  allocator local_43d;
  allocator local_43c;
  allocator local_43b;
  allocator local_43a;
  allocator local_439;
  allocator local_438;
  allocator local_437;
  allocator local_436;
  allocator local_435;
  allocator local_434;
  allocator local_433;
  allocator local_432;
  allocator local_431;
  allocator local_430;
  allocator local_42f;
  allocator local_42e;
  allocator local_42d;
  allocator local_42c;
  allocator local_42b;
  allocator local_42a;
  allocator local_429;
  string local_428 [39];
  allocator local_401;
  string local_400 [38];
  undefined1 local_3da;
  allocator local_3d9;
  string local_3d8 [37];
  allocator local_3b3;
  allocator local_3b2;
  allocator local_3b1;
  string local_3b0 [39];
  allocator local_389;
  string local_388 [38];
  undefined1 local_362;
  allocator local_361;
  string local_360 [38];
  allocator local_33a;
  allocator local_339;
  string local_338 [39];
  allocator local_311;
  string local_310 [38];
  undefined1 local_2ea;
  allocator local_2e9;
  string local_2e8 [38];
  allocator local_2c2;
  allocator local_2c1;
  string local_2c0 [37];
  allocator local_29b;
  allocator local_29a;
  allocator local_299;
  string local_298 [38];
  undefined1 local_272;
  allocator local_271;
  string local_270 [38];
  allocator local_24a;
  allocator local_249;
  string local_248 [37];
  allocator local_223;
  allocator local_222;
  allocator local_221;
  string local_220 [38];
  undefined1 local_1fa;
  allocator local_1f9;
  string local_1f8 [38];
  allocator local_1d2;
  allocator local_1d1;
  string local_1d0 [37];
  allocator local_1ab;
  allocator local_1aa;
  allocator local_1a9;
  string local_1a8 [38];
  undefined1 local_182;
  allocator local_181;
  string local_180 [34];
  allocator local_15e;
  allocator local_15d;
  allocator local_15c;
  allocator local_15b;
  allocator local_15a;
  allocator local_159;
  allocator local_158;
  allocator local_157;
  allocator local_156;
  allocator local_155;
  allocator local_154;
  allocator local_153;
  allocator local_152;
  allocator local_151;
  allocator local_150;
  allocator local_14f;
  allocator local_14e;
  allocator local_14d;
  allocator local_14c;
  allocator local_14b;
  allocator local_14a;
  allocator local_149;
  string local_148 [39];
  allocator local_121;
  string local_120 [35];
  allocator local_fd;
  allocator local_fc;
  allocator local_fb;
  allocator local_fa;
  allocator local_f9;
  string local_f8 [38];
  undefined1 local_d2;
  allocator local_d1;
  string local_d0 [32];
  ExecutionModel local_b0;
  allocator local_ab;
  undefined1 local_aa;
  allocator local_a9;
  ExecutionModel model;
  allocator local_82;
  allocator local_81;
  string local_80 [38];
  allocator local_5a;
  allocator local_59;
  string local_58 [35];
  allocator local_35 [20];
  allocator local_21;
  int local_20;
  StorageClass local_1c;
  StorageClass storage_local;
  BuiltIn builtin_local;
  CompilerGLSL *this_local;
  
  this_00 = (CompilerGLSL *)CONCAT44(in_register_00000034,builtin);
  local_1c = storage;
  _storage_local = this_00;
  this_local = this;
  if (storage == StorageClassUniformConstant) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"gl_Position",&local_21);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_21);
  }
  else if (storage == StorageClassInput) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"gl_PointSize",local_35);
    ::std::allocator<char>::~allocator((allocator<char> *)local_35);
  }
  else if (storage == StorageClassOutput) {
    if (((this_00->options).es & 1U) != 0) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_58,"GL_EXT_clip_cull_distance",&local_59);
      require_extension_internal(this_00,(string *)local_58);
      ::std::__cxx11::string::~string(local_58);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_59);
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"gl_ClipDistance",&local_5a);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_5a);
  }
  else if (storage == StorageClassWorkgroup) {
    if (((this_00->options).es & 1U) != 0) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_80,"GL_EXT_clip_cull_distance",&local_81);
      require_extension_internal(this_00,(string *)local_80);
      ::std::__cxx11::string::~string(local_80);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_81);
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"gl_CullDistance",&local_82);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_82);
  }
  else if (storage == StorageClassCrossWorkgroup) {
    if (((this_00->options).vulkan_semantics & 1U) != 0) {
      local_aa = 1;
      pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&model,
                 "Cannot implement gl_VertexID in Vulkan GLSL. This shader was created with GL semantics."
                 ,&local_a9);
      CompilerError::CompilerError(pCVar4,(string *)&model);
      local_aa = 0;
      __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"gl_VertexID",&local_ab);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_ab);
  }
  else if (storage == StorageClassPrivate) {
    if (((this_00->options).vulkan_semantics & 1U) != 0) {
      pSVar2 = Compiler::get_entry_point((Compiler *)this_00);
      local_b0 = pSVar2->model;
      if (2 < local_b0 - ExecutionModelIntersectionKHR) {
        local_d2 = 1;
        pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_d0,
                   "Cannot implement gl_InstanceID in Vulkan GLSL. This shader was created with GL semantics."
                   ,&local_d1);
        CompilerError::CompilerError(pCVar4,(string *)local_d0);
        local_d2 = 0;
        __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
    }
    if ((((this_00->options).es & 1U) == 0) && ((this_00->options).version < 0x8c)) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_f8,"GL_ARB_draw_instanced",&local_f9);
      require_extension_internal(this_00,(string *)local_f8);
      ::std::__cxx11::string::~string(local_f8);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_f9);
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"gl_InstanceID",&local_fa);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_fa);
  }
  else if (storage == StorageClassFunction) {
    if ((in_ECX == 1) &&
       (pSVar2 = Compiler::get_entry_point((Compiler *)this_00),
       pSVar2->model == ExecutionModelGeometry)) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)this,"gl_PrimitiveIDIn",&local_14c);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_14c);
    }
    else {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)this,"gl_PrimitiveID",&local_14d);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_14d);
    }
  }
  else if (storage == StorageClassGeneric) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"gl_InvocationID",&local_14e);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_14e);
  }
  else if (storage == StorageClassPushConstant) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"gl_Layer",&local_14f);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_14f);
  }
  else if (storage == StorageClassAtomicCounter) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"gl_ViewportIndex",&local_150);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_150);
  }
  else if (storage == StorageClassImage) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"gl_TessLevelOuter",&local_151);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_151);
  }
  else if (storage == StorageClassStorageBuffer) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"gl_TessLevelInner",&local_152);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_152);
  }
  else if (storage == (StorageClassStorageBuffer|StorageClassInput)) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"gl_TessCoord",&local_153);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_153);
  }
  else if (storage == (StorageClassStorageBuffer|StorageClassOutput)) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"gl_FragCoord",&local_154);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_154);
  }
  else if (storage == 0x10) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"gl_PointCoord",&local_155);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_155);
  }
  else if (storage == 0x11) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"gl_FrontFacing",&local_156);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_156);
  }
  else if (storage == 0x12) {
    bVar1 = is_legacy(this_00);
    if (bVar1) {
      local_2ea = 1;
      pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_2e8,"Sample variables not supported in legacy GLSL.",&local_2e9);
      CompilerError::CompilerError(pCVar4,(string *)local_2e8);
      local_2ea = 0;
      __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    if ((((this_00->options).es & 1U) == 0) || (0x13f < (this_00->options).version)) {
      if ((((this_00->options).es & 1U) == 0) && ((this_00->options).version < 400)) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_338,"GL_ARB_sample_shading",&local_339);
        require_extension_internal(this_00,(string *)local_338);
        ::std::__cxx11::string::~string(local_338);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_339);
      }
    }
    else {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_310,"GL_OES_sample_variables",&local_311);
      require_extension_internal(this_00,(string *)local_310);
      ::std::__cxx11::string::~string(local_310);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_311);
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"gl_SampleID",&local_33a);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_33a);
  }
  else if (storage == 0x13) {
    bVar1 = is_legacy(this_00);
    if (bVar1) {
      local_3da = 1;
      pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_3d8,"Sample variables not supported in legacy GLSL.",&local_3d9);
      CompilerError::CompilerError(pCVar4,(string *)local_3d8);
      local_3da = 0;
      __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    if ((((this_00->options).es & 1U) == 0) || (0x13f < (this_00->options).version)) {
      if ((((this_00->options).es & 1U) == 0) && ((this_00->options).version < 400)) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_428,"GL_ARB_sample_shading",&local_429);
        require_extension_internal(this_00,(string *)local_428);
        ::std::__cxx11::string::~string(local_428);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_429);
      }
    }
    else {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_400,"GL_OES_sample_variables",&local_401);
      require_extension_internal(this_00,(string *)local_400);
      ::std::__cxx11::string::~string(local_400);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_401);
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"gl_SamplePosition",&local_42a);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_42a);
  }
  else if (storage == 0x14) {
    local_20 = in_ECX;
    bVar1 = is_legacy(this_00);
    if (bVar1) {
      local_362 = 1;
      pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_360,"Sample variables not supported in legacy GLSL.",&local_361);
      CompilerError::CompilerError(pCVar4,(string *)local_360);
      local_362 = 0;
      __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    if ((((this_00->options).es & 1U) == 0) || (0x13f < (this_00->options).version)) {
      if ((((this_00->options).es & 1U) == 0) && ((this_00->options).version < 400)) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_3b0,"GL_ARB_sample_shading",&local_3b1);
        require_extension_internal(this_00,(string *)local_3b0);
        ::std::__cxx11::string::~string(local_3b0);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_3b1);
      }
    }
    else {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_388,"GL_OES_sample_variables",&local_389);
      require_extension_internal(this_00,(string *)local_388);
      ::std::__cxx11::string::~string(local_388);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_389);
    }
    if (local_20 == 1) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)this,"gl_SampleMaskIn",&local_3b2);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_3b2);
    }
    else {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)this,"gl_SampleMask",&local_3b3);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_3b3);
    }
  }
  else if (storage == 0x16) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"gl_FragDepth",&local_157);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_157);
  }
  else if (storage == 0x17) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"gl_HelperInvocation",&local_15e);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_15e);
  }
  else if (storage == 0x18) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"gl_NumWorkGroups",&local_158);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_158);
  }
  else if (storage == 0x19) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"gl_WorkGroupSize",&local_159);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_159);
  }
  else if (storage == 0x1a) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"gl_WorkGroupID",&local_15a);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_15a);
  }
  else if (storage == 0x1b) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"gl_LocalInvocationID",&local_15b);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_15b);
  }
  else if (storage == 0x1c) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"gl_GlobalInvocationID",&local_15c);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_15c);
  }
  else if (storage == 0x1d) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"gl_LocalInvocationIndex",&local_15d);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_15d);
  }
  else if (storage == 0x24) {
    request_subgroup_feature(this_00,SubgroupSize);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"gl_SubgroupSize",&local_42f);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_42f);
  }
  else if (storage == 0x26) {
    request_subgroup_feature(this_00,NumSubgroups);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"gl_NumSubgroups",&local_42d);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_42d);
  }
  else if (storage == 0x28) {
    request_subgroup_feature(this_00,SubgroupID);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"gl_SubgroupID",&local_42e);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_42e);
  }
  else if (storage == 0x29) {
    request_subgroup_feature(this_00,SubgroupInvocationID);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"gl_SubgroupInvocationID",&local_430);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_430);
  }
  else if (storage == 0x2a) {
    if (((this_00->options).vulkan_semantics & 1U) == 0) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)this,"gl_VertexID",&local_fc);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_fc);
    }
    else {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)this,"gl_VertexIndex",&local_fb);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_fb);
    }
  }
  else if (storage == 0x2b) {
    if (((this_00->options).vulkan_semantics & 1U) == 0) {
      if ((((this_00->options).es & 1U) == 0) && ((this_00->options).version < 0x8c)) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_120,"GL_ARB_draw_instanced",&local_121);
        require_extension_internal(this_00,(string *)local_120);
        ::std::__cxx11::string::~string(local_120);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_121);
      }
      if (((this_00->options).vertex.support_nonzero_base_instance & 1U) == 0) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)this,"gl_InstanceID",&local_14b);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_14b);
      }
      else {
        if (((this_00->options).vulkan_semantics & 1U) == 0) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string(local_148,"GL_ARB_shader_draw_parameters",&local_149);
          require_extension_internal(this_00,(string *)local_148);
          ::std::__cxx11::string::~string(local_148);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_149);
        }
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)this,"(gl_InstanceID + SPIRV_Cross_BaseInstance)",&local_14a);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_14a);
      }
    }
    else {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)this,"gl_InstanceIndex",&local_fd);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_fd);
    }
  }
  else if (storage == 0x1140) {
    request_subgroup_feature(this_00,SubgroupMask);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"gl_SubgroupEqMask",&local_431);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_431);
  }
  else if (storage == 0x1141) {
    request_subgroup_feature(this_00,SubgroupMask);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"gl_SubgroupGeMask",&local_432);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_432);
  }
  else if (storage == 0x1142) {
    request_subgroup_feature(this_00,SubgroupMask);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"gl_SubgroupGtMask",&local_433);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_433);
  }
  else if (storage == 0x1143) {
    request_subgroup_feature(this_00,SubgroupMask);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"gl_SubgroupLeMask",&local_434);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_434);
  }
  else if (storage == 0x1144) {
    request_subgroup_feature(this_00,SubgroupMask);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"gl_SubgroupLtMask",&local_435);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_435);
  }
  else if (storage == 0x1148) {
    if (((this_00->options).es & 1U) != 0) {
      local_182 = 1;
      pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_180,"BaseVertex not supported in ES profile.",&local_181)
      ;
      CompilerError::CompilerError(pCVar4,(string *)local_180);
      local_182 = 0;
      __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    if (((this_00->options).vulkan_semantics & 1U) == 0) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1d0,"GL_ARB_shader_draw_parameters",&local_1d1);
      require_extension_internal(this_00,(string *)local_1d0);
      ::std::__cxx11::string::~string(local_1d0);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)this,"SPIRV_Cross_BaseVertex",&local_1d2);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1d2);
    }
    else if ((this_00->options).version < 0x1cc) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1a8,"GL_ARB_shader_draw_parameters",&local_1a9);
      require_extension_internal(this_00,(string *)local_1a8);
      ::std::__cxx11::string::~string(local_1a8);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)this,"gl_BaseVertexARB",&local_1aa);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1aa);
    }
    else {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)this,"gl_BaseVertex",&local_1ab);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1ab);
    }
  }
  else if (storage == 0x1149) {
    if (((this_00->options).es & 1U) != 0) {
      local_1fa = 1;
      pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_1f8,"BaseInstance not supported in ES profile.",&local_1f9);
      CompilerError::CompilerError(pCVar4,(string *)local_1f8);
      local_1fa = 0;
      __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    if (((this_00->options).vulkan_semantics & 1U) == 0) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_248,"GL_ARB_shader_draw_parameters",&local_249);
      require_extension_internal(this_00,(string *)local_248);
      ::std::__cxx11::string::~string(local_248);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_249);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)this,"SPIRV_Cross_BaseInstance",&local_24a);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_24a);
    }
    else if ((this_00->options).version < 0x1cc) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_220,"GL_ARB_shader_draw_parameters",&local_221);
      require_extension_internal(this_00,(string *)local_220);
      ::std::__cxx11::string::~string(local_220);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_221);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)this,"gl_BaseInstanceARB",&local_222);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_222);
    }
    else {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)this,"gl_BaseInstance",&local_223);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_223);
    }
  }
  else if (storage == 0x114a) {
    if (((this_00->options).es & 1U) != 0) {
      local_272 = 1;
      pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_270,"DrawIndex not supported in ES profile.",&local_271);
      CompilerError::CompilerError(pCVar4,(string *)local_270);
      local_272 = 0;
      __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    if (((this_00->options).vulkan_semantics & 1U) == 0) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_2c0,"GL_ARB_shader_draw_parameters",&local_2c1);
      require_extension_internal(this_00,(string *)local_2c0);
      ::std::__cxx11::string::~string(local_2c0);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)this,"gl_DrawIDARB",&local_2c2);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2c2);
    }
    else if ((this_00->options).version < 0x1cc) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_298,"GL_ARB_shader_draw_parameters",&local_299);
      require_extension_internal(this_00,(string *)local_298);
      ::std::__cxx11::string::~string(local_298);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_299);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)this,"gl_DrawIDARB",&local_29a);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_29a);
    }
    else {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)this,"gl_DrawID",&local_29b);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_29b);
    }
  }
  else if (storage == 0x1150) {
    if (((this_00->options).vulkan_semantics & 1U) == 0) {
      local_5fa = 1;
      pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_5f8,"Can only use PrimitiveShadingRateKHR in Vulkan GLSL.",&local_5f9);
      CompilerError::CompilerError(pCVar4,(string *)local_5f8);
      local_5fa = 0;
      __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_620,"GL_EXT_fragment_shading_rate",&local_621);
    require_extension_internal(this_00,(string *)local_620);
    ::std::__cxx11::string::~string(local_620);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_621);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"gl_PrimitiveShadingRateEXT",&local_622);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_622);
  }
  else if (storage == 0x1156) {
    if (((this_00->options).vulkan_semantics & 1U) == 0) {
      local_69a = 1;
      pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_698,"Need Vulkan semantics for device group support.",&local_699);
      CompilerError::CompilerError(pCVar4,(string *)local_698);
      local_69a = 0;
      __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_6c0,"GL_EXT_device_group",&local_6c1);
    require_extension_internal(this_00,(string *)local_6c0);
    ::std::__cxx11::string::~string(local_6c0);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_6c1);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"gl_DeviceIndex",&local_6c2);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_6c2);
  }
  else if (storage == 0x1158) {
    if (((this_00->options).vulkan_semantics & 1U) == 0) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)this,"gl_ViewID_OVR",&local_42c);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_42c);
    }
    else {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)this,"gl_ViewIndex",&local_42b);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_42b);
    }
  }
  else if (storage == 0x115c) {
    if (((this_00->options).vulkan_semantics & 1U) == 0) {
      local_64a = 1;
      pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_648,"Can only use ShadingRateKHR in Vulkan GLSL.",&local_649);
      CompilerError::CompilerError(pCVar4,(string *)local_648);
      local_64a = 0;
      __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_670,"GL_EXT_fragment_shading_rate",&local_671);
    require_extension_internal(this_00,(string *)local_670);
    ::std::__cxx11::string::~string(local_670);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_671);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"gl_ShadingRateEXT",&local_672);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_672);
  }
  else if (storage == 0x1396) {
    if (((this_00->options).es & 1U) != 0) {
      local_5d2 = 1;
      pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_5d0,"Stencil export not supported in GLES.",&local_5d1);
      CompilerError::CompilerError(pCVar4,(string *)local_5d0);
      local_5d2 = 0;
      __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_5a8,"GL_ARB_shader_stencil_export",&local_5a9);
    require_extension_internal(this_00,(string *)local_5a8);
    ::std::__cxx11::string::~string(local_5a8);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_5a9);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"gl_FragStencilRefARB",&local_5aa);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_5aa);
  }
  else if (storage == 0x1490) {
    if (((this_00->options).es & 1U) != 0) {
      local_712 = 1;
      pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_710,"Need desktop GL to use GL_NV_conservative_raster_underestimation.",
                 &local_711);
      CompilerError::CompilerError(pCVar4,(string *)local_710);
      local_712 = 0;
      __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_6e8,"GL_NV_conservative_raster_underestimation",&local_6e9)
    ;
    require_extension_internal(this_00,(string *)local_6e8);
    ::std::__cxx11::string::~string(local_6e8);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_6e9);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"gl_FragFullyCoveredNV",&local_713);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_713);
  }
  else if (storage == 0x14a6) {
    if ((((this_00->options).es & 1U) != 0) && ((this_00->options).version < 0x140)) {
      local_46a = 1;
      pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_468,"gl_BaryCoordEXT requires ESSL 320.",&local_469);
      CompilerError::CompilerError(pCVar4,(string *)local_468);
      local_46a = 0;
      __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    if ((((this_00->options).es & 1U) == 0) && ((this_00->options).version < 0x1c2)) {
      local_492 = 1;
      pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_490,"gl_BaryCoordEXT requires GLSL 450.",&local_491);
      CompilerError::CompilerError(pCVar4,(string *)local_490);
      local_492 = 0;
      __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    if ((this_00->barycentric_is_nv & 1U) == 0) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_4e0,"GL_EXT_fragment_shader_barycentric",&local_4e1);
      require_extension_internal(this_00,(string *)local_4e0);
      ::std::__cxx11::string::~string(local_4e0);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_4e1);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)this,"gl_BaryCoordEXT",&local_4e2);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_4e2);
    }
    else {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_4b8,"GL_NV_fragment_shader_barycentric",&local_4b9);
      require_extension_internal(this_00,(string *)local_4b8);
      ::std::__cxx11::string::~string(local_4b8);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_4b9);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)this,"gl_BaryCoordNV",&local_4ba);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_4ba);
    }
  }
  else if (storage == 0x14a7) {
    if ((((this_00->options).es & 1U) != 0) && ((this_00->options).version < 0x140)) {
      local_50a = 1;
      pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_508,"gl_BaryCoordNoPerspEXT requires ESSL 320.",&local_509);
      CompilerError::CompilerError(pCVar4,(string *)local_508);
      local_50a = 0;
      __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    if ((((this_00->options).es & 1U) == 0) && ((this_00->options).version < 0x1c2)) {
      local_532 = 1;
      pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_530,"gl_BaryCoordNoPerspEXT requires GLSL 450.",&local_531);
      CompilerError::CompilerError(pCVar4,(string *)local_530);
      local_532 = 0;
      __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    if ((this_00->barycentric_is_nv & 1U) == 0) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_580,"GL_EXT_fragment_shader_barycentric",&local_581);
      require_extension_internal(this_00,(string *)local_580);
      ::std::__cxx11::string::~string(local_580);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_581);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)this,"gl_BaryCoordNoPerspEXT",&local_582);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_582);
    }
    else {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_558,"GL_NV_fragment_shader_barycentric",&local_559);
      require_extension_internal(this_00,(string *)local_558);
      ::std::__cxx11::string::~string(local_558);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_559);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)this,"gl_BaryCoordNoPerspNV",&local_55a);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_55a);
    }
  }
  else if (storage == 0x14ae) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"gl_PrimitivePointIndicesEXT",&local_716);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_716);
  }
  else if (storage == 0x14af) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"gl_PrimitiveLineIndicesEXT",&local_715);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_715);
  }
  else if (storage == 0x14b0) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"gl_PrimitiveTriangleIndicesEXT",&local_714);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_714);
  }
  else if (storage == 0x14b3) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"gl_CullPrimitiveEXT",&local_717);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_717);
  }
  else if (storage == 0x14c7) {
    pcVar3 = "gl_LaunchIDNV";
    if ((this_00->ray_tracing_is_khr & 1U) != 0) {
      pcVar3 = "gl_LaunchIDEXT";
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,pcVar3,&local_436);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_436);
  }
  else if (storage == 0x14c8) {
    pcVar3 = "gl_LaunchSizeNV";
    if ((this_00->ray_tracing_is_khr & 1U) != 0) {
      pcVar3 = "gl_LaunchSizeEXT";
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,pcVar3,&local_437);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_437);
  }
  else if (storage == 0x14c9) {
    pcVar3 = "gl_WorldRayOriginNV";
    if ((this_00->ray_tracing_is_khr & 1U) != 0) {
      pcVar3 = "gl_WorldRayOriginEXT";
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,pcVar3,&local_438);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_438);
  }
  else if (storage == 0x14ca) {
    pcVar3 = "gl_WorldRayDirectionNV";
    if ((this_00->ray_tracing_is_khr & 1U) != 0) {
      pcVar3 = "gl_WorldRayDirectionEXT";
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,pcVar3,&local_439);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_439);
  }
  else if (storage == 0x14cb) {
    pcVar3 = "gl_ObjectRayOriginNV";
    if ((this_00->ray_tracing_is_khr & 1U) != 0) {
      pcVar3 = "gl_ObjectRayOriginEXT";
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,pcVar3,&local_43a);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_43a);
  }
  else if (storage == 0x14cc) {
    pcVar3 = "gl_ObjectRayDirectionNV";
    if ((this_00->ray_tracing_is_khr & 1U) != 0) {
      pcVar3 = "gl_ObjectRayDirectionEXT";
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,pcVar3,&local_43b);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_43b);
  }
  else if (storage == 0x14cd) {
    pcVar3 = "gl_RayTminNV";
    if ((this_00->ray_tracing_is_khr & 1U) != 0) {
      pcVar3 = "gl_RayTminEXT";
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,pcVar3,&local_43c);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_43c);
  }
  else if (storage == 0x14ce) {
    pcVar3 = "gl_RayTmaxNV";
    if ((this_00->ray_tracing_is_khr & 1U) != 0) {
      pcVar3 = "gl_RayTmaxEXT";
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,pcVar3,&local_43d);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_43d);
  }
  else if (storage == 0x14cf) {
    pcVar3 = "gl_InstanceCustomIndexNV";
    if ((this_00->ray_tracing_is_khr & 1U) != 0) {
      pcVar3 = "gl_InstanceCustomIndexEXT";
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,pcVar3,&local_43e);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_43e);
  }
  else if (storage == (StorageClassCallableDataKHR|StorageClassUniform)) {
    pcVar3 = "gl_ObjectToWorldNV";
    if ((this_00->ray_tracing_is_khr & 1U) != 0) {
      pcVar3 = "gl_ObjectToWorldEXT";
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,pcVar3,&local_43f);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_43f);
  }
  else if (storage == (StorageClassCallableDataKHR|StorageClassOutput)) {
    pcVar3 = "gl_WorldToObjectNV";
    if ((this_00->ray_tracing_is_khr & 1U) != 0) {
      pcVar3 = "gl_WorldToObjectEXT";
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,pcVar3,&local_440);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_440);
  }
  else if (storage == (StorageClassCallableDataKHR|StorageClassWorkgroup)) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"gl_HitTNV",&local_441);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_441);
  }
  else if (storage == (StorageClassCallableDataKHR|StorageClassCrossWorkgroup)) {
    pcVar3 = "gl_HitKindNV";
    if ((this_00->ray_tracing_is_khr & 1U) != 0) {
      pcVar3 = "gl_HitKindEXT";
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,pcVar3,&local_442);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_442);
  }
  else if (storage == 0x14e7) {
    pcVar3 = "gl_IncomingRayFlagsNV";
    if ((this_00->ray_tracing_is_khr & 1U) != 0) {
      pcVar3 = "gl_IncomingRayFlagsEXT";
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,pcVar3,&local_443);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_443);
  }
  else {
    convert_to_string<spv::BuiltIn,_0>(local_738,&local_1c);
    join<char_const(&)[12],std::__cxx11::string>
              ((spirv_cross *)this,(char (*) [12])"gl_BuiltIn_",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_738);
    ::std::__cxx11::string::~string((string *)local_738);
  }
  return this;
}

Assistant:

string CompilerGLSL::builtin_to_glsl(BuiltIn builtin, StorageClass storage)
{
	switch (builtin)
	{
	case BuiltInPosition:
		return "gl_Position";
	case BuiltInPointSize:
		return "gl_PointSize";
	case BuiltInClipDistance:
	{
		if (options.es)
			require_extension_internal("GL_EXT_clip_cull_distance");
		return "gl_ClipDistance";
	}
	case BuiltInCullDistance:
	{
		if (options.es)
			require_extension_internal("GL_EXT_clip_cull_distance");
		return "gl_CullDistance";
	}
	case BuiltInVertexId:
		if (options.vulkan_semantics)
			SPIRV_CROSS_THROW("Cannot implement gl_VertexID in Vulkan GLSL. This shader was created "
			                  "with GL semantics.");
		return "gl_VertexID";
	case BuiltInInstanceId:
		if (options.vulkan_semantics)
		{
			auto model = get_entry_point().model;
			switch (model)
			{
			case spv::ExecutionModelIntersectionKHR:
			case spv::ExecutionModelAnyHitKHR:
			case spv::ExecutionModelClosestHitKHR:
				// gl_InstanceID is allowed in these shaders.
				break;

			default:
				SPIRV_CROSS_THROW("Cannot implement gl_InstanceID in Vulkan GLSL. This shader was "
				                  "created with GL semantics.");
			}
		}
		if (!options.es && options.version < 140)
		{
			require_extension_internal("GL_ARB_draw_instanced");
		}
		return "gl_InstanceID";
	case BuiltInVertexIndex:
		if (options.vulkan_semantics)
			return "gl_VertexIndex";
		else
			return "gl_VertexID"; // gl_VertexID already has the base offset applied.
	case BuiltInInstanceIndex:
		if (options.vulkan_semantics)
			return "gl_InstanceIndex";

		if (!options.es && options.version < 140)
		{
			require_extension_internal("GL_ARB_draw_instanced");
		}

		if (options.vertex.support_nonzero_base_instance)
		{
			if (!options.vulkan_semantics)
			{
				// This is a soft-enable. We will opt-in to using gl_BaseInstanceARB if supported.
				require_extension_internal("GL_ARB_shader_draw_parameters");
			}
			return "(gl_InstanceID + SPIRV_Cross_BaseInstance)"; // ... but not gl_InstanceID.
		}
		else
			return "gl_InstanceID";
	case BuiltInPrimitiveId:
		if (storage == StorageClassInput && get_entry_point().model == ExecutionModelGeometry)
			return "gl_PrimitiveIDIn";
		else
			return "gl_PrimitiveID";
	case BuiltInInvocationId:
		return "gl_InvocationID";
	case BuiltInLayer:
		return "gl_Layer";
	case BuiltInViewportIndex:
		return "gl_ViewportIndex";
	case BuiltInTessLevelOuter:
		return "gl_TessLevelOuter";
	case BuiltInTessLevelInner:
		return "gl_TessLevelInner";
	case BuiltInTessCoord:
		return "gl_TessCoord";
	case BuiltInFragCoord:
		return "gl_FragCoord";
	case BuiltInPointCoord:
		return "gl_PointCoord";
	case BuiltInFrontFacing:
		return "gl_FrontFacing";
	case BuiltInFragDepth:
		return "gl_FragDepth";
	case BuiltInNumWorkgroups:
		return "gl_NumWorkGroups";
	case BuiltInWorkgroupSize:
		return "gl_WorkGroupSize";
	case BuiltInWorkgroupId:
		return "gl_WorkGroupID";
	case BuiltInLocalInvocationId:
		return "gl_LocalInvocationID";
	case BuiltInGlobalInvocationId:
		return "gl_GlobalInvocationID";
	case BuiltInLocalInvocationIndex:
		return "gl_LocalInvocationIndex";
	case BuiltInHelperInvocation:
		return "gl_HelperInvocation";

	case BuiltInBaseVertex:
		if (options.es)
			SPIRV_CROSS_THROW("BaseVertex not supported in ES profile.");

		if (options.vulkan_semantics)
		{
			if (options.version < 460)
			{
				require_extension_internal("GL_ARB_shader_draw_parameters");
				return "gl_BaseVertexARB";
			}
			return "gl_BaseVertex";
		}
		// On regular GL, this is soft-enabled and we emit ifdefs in code.
		require_extension_internal("GL_ARB_shader_draw_parameters");
		return "SPIRV_Cross_BaseVertex";

	case BuiltInBaseInstance:
		if (options.es)
			SPIRV_CROSS_THROW("BaseInstance not supported in ES profile.");

		if (options.vulkan_semantics)
		{
			if (options.version < 460)
			{
				require_extension_internal("GL_ARB_shader_draw_parameters");
				return "gl_BaseInstanceARB";
			}
			return "gl_BaseInstance";
		}
		// On regular GL, this is soft-enabled and we emit ifdefs in code.
		require_extension_internal("GL_ARB_shader_draw_parameters");
		return "SPIRV_Cross_BaseInstance";

	case BuiltInDrawIndex:
		if (options.es)
			SPIRV_CROSS_THROW("DrawIndex not supported in ES profile.");

		if (options.vulkan_semantics)
		{
			if (options.version < 460)
			{
				require_extension_internal("GL_ARB_shader_draw_parameters");
				return "gl_DrawIDARB";
			}
			return "gl_DrawID";
		}
		// On regular GL, this is soft-enabled and we emit ifdefs in code.
		require_extension_internal("GL_ARB_shader_draw_parameters");
		return "gl_DrawIDARB";

	case BuiltInSampleId:
		if (is_legacy())
			SPIRV_CROSS_THROW("Sample variables not supported in legacy GLSL.");
		else if (options.es && options.version < 320)
			require_extension_internal("GL_OES_sample_variables");
		else if (!options.es && options.version < 400)
			require_extension_internal("GL_ARB_sample_shading");
		return "gl_SampleID";

	case BuiltInSampleMask:
		if (is_legacy())
			SPIRV_CROSS_THROW("Sample variables not supported in legacy GLSL.");
		else if (options.es && options.version < 320)
			require_extension_internal("GL_OES_sample_variables");
		else if (!options.es && options.version < 400)
			require_extension_internal("GL_ARB_sample_shading");

		if (storage == StorageClassInput)
			return "gl_SampleMaskIn";
		else
			return "gl_SampleMask";

	case BuiltInSamplePosition:
		if (is_legacy())
			SPIRV_CROSS_THROW("Sample variables not supported in legacy GLSL.");
		else if (options.es && options.version < 320)
			require_extension_internal("GL_OES_sample_variables");
		else if (!options.es && options.version < 400)
			require_extension_internal("GL_ARB_sample_shading");
		return "gl_SamplePosition";

	case BuiltInViewIndex:
		if (options.vulkan_semantics)
			return "gl_ViewIndex";
		else
			return "gl_ViewID_OVR";

	case BuiltInNumSubgroups:
		request_subgroup_feature(ShaderSubgroupSupportHelper::NumSubgroups);
		return "gl_NumSubgroups";

	case BuiltInSubgroupId:
		request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupID);
		return "gl_SubgroupID";

	case BuiltInSubgroupSize:
		request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupSize);
		return "gl_SubgroupSize";

	case BuiltInSubgroupLocalInvocationId:
		request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupInvocationID);
		return "gl_SubgroupInvocationID";

	case BuiltInSubgroupEqMask:
		request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupMask);
		return "gl_SubgroupEqMask";

	case BuiltInSubgroupGeMask:
		request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupMask);
		return "gl_SubgroupGeMask";

	case BuiltInSubgroupGtMask:
		request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupMask);
		return "gl_SubgroupGtMask";

	case BuiltInSubgroupLeMask:
		request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupMask);
		return "gl_SubgroupLeMask";

	case BuiltInSubgroupLtMask:
		request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupMask);
		return "gl_SubgroupLtMask";

	case BuiltInLaunchIdKHR:
		return ray_tracing_is_khr ? "gl_LaunchIDEXT" : "gl_LaunchIDNV";
	case BuiltInLaunchSizeKHR:
		return ray_tracing_is_khr ? "gl_LaunchSizeEXT" : "gl_LaunchSizeNV";
	case BuiltInWorldRayOriginKHR:
		return ray_tracing_is_khr ? "gl_WorldRayOriginEXT" : "gl_WorldRayOriginNV";
	case BuiltInWorldRayDirectionKHR:
		return ray_tracing_is_khr ? "gl_WorldRayDirectionEXT" : "gl_WorldRayDirectionNV";
	case BuiltInObjectRayOriginKHR:
		return ray_tracing_is_khr ? "gl_ObjectRayOriginEXT" : "gl_ObjectRayOriginNV";
	case BuiltInObjectRayDirectionKHR:
		return ray_tracing_is_khr ? "gl_ObjectRayDirectionEXT" : "gl_ObjectRayDirectionNV";
	case BuiltInRayTminKHR:
		return ray_tracing_is_khr ? "gl_RayTminEXT" : "gl_RayTminNV";
	case BuiltInRayTmaxKHR:
		return ray_tracing_is_khr ? "gl_RayTmaxEXT" : "gl_RayTmaxNV";
	case BuiltInInstanceCustomIndexKHR:
		return ray_tracing_is_khr ? "gl_InstanceCustomIndexEXT" : "gl_InstanceCustomIndexNV";
	case BuiltInObjectToWorldKHR:
		return ray_tracing_is_khr ? "gl_ObjectToWorldEXT" : "gl_ObjectToWorldNV";
	case BuiltInWorldToObjectKHR:
		return ray_tracing_is_khr ? "gl_WorldToObjectEXT" : "gl_WorldToObjectNV";
	case BuiltInHitTNV:
		// gl_HitTEXT is an alias of RayTMax in KHR.
		return "gl_HitTNV";
	case BuiltInHitKindKHR:
		return ray_tracing_is_khr ? "gl_HitKindEXT" : "gl_HitKindNV";
	case BuiltInIncomingRayFlagsKHR:
		return ray_tracing_is_khr ? "gl_IncomingRayFlagsEXT" : "gl_IncomingRayFlagsNV";

	case BuiltInBaryCoordKHR:
	{
		if (options.es && options.version < 320)
			SPIRV_CROSS_THROW("gl_BaryCoordEXT requires ESSL 320.");
		else if (!options.es && options.version < 450)
			SPIRV_CROSS_THROW("gl_BaryCoordEXT requires GLSL 450.");

		if (barycentric_is_nv)
		{
			require_extension_internal("GL_NV_fragment_shader_barycentric");
			return "gl_BaryCoordNV";
		}
		else
		{
			require_extension_internal("GL_EXT_fragment_shader_barycentric");
			return "gl_BaryCoordEXT";
		}
	}

	case BuiltInBaryCoordNoPerspNV:
	{
		if (options.es && options.version < 320)
			SPIRV_CROSS_THROW("gl_BaryCoordNoPerspEXT requires ESSL 320.");
		else if (!options.es && options.version < 450)
			SPIRV_CROSS_THROW("gl_BaryCoordNoPerspEXT requires GLSL 450.");

		if (barycentric_is_nv)
		{
			require_extension_internal("GL_NV_fragment_shader_barycentric");
			return "gl_BaryCoordNoPerspNV";
		}
		else
		{
			require_extension_internal("GL_EXT_fragment_shader_barycentric");
			return "gl_BaryCoordNoPerspEXT";
		}
	}

	case BuiltInFragStencilRefEXT:
	{
		if (!options.es)
		{
			require_extension_internal("GL_ARB_shader_stencil_export");
			return "gl_FragStencilRefARB";
		}
		else
			SPIRV_CROSS_THROW("Stencil export not supported in GLES.");
	}

	case BuiltInPrimitiveShadingRateKHR:
	{
		if (!options.vulkan_semantics)
			SPIRV_CROSS_THROW("Can only use PrimitiveShadingRateKHR in Vulkan GLSL.");
		require_extension_internal("GL_EXT_fragment_shading_rate");
		return "gl_PrimitiveShadingRateEXT";
	}

	case BuiltInShadingRateKHR:
	{
		if (!options.vulkan_semantics)
			SPIRV_CROSS_THROW("Can only use ShadingRateKHR in Vulkan GLSL.");
		require_extension_internal("GL_EXT_fragment_shading_rate");
		return "gl_ShadingRateEXT";
	}

	case BuiltInDeviceIndex:
		if (!options.vulkan_semantics)
			SPIRV_CROSS_THROW("Need Vulkan semantics for device group support.");
		require_extension_internal("GL_EXT_device_group");
		return "gl_DeviceIndex";

	case BuiltInFullyCoveredEXT:
		if (!options.es)
			require_extension_internal("GL_NV_conservative_raster_underestimation");
		else
			SPIRV_CROSS_THROW("Need desktop GL to use GL_NV_conservative_raster_underestimation.");
		return "gl_FragFullyCoveredNV";

	case BuiltInPrimitiveTriangleIndicesEXT:
		return "gl_PrimitiveTriangleIndicesEXT";
	case BuiltInPrimitiveLineIndicesEXT:
		return "gl_PrimitiveLineIndicesEXT";
	case BuiltInPrimitivePointIndicesEXT:
		return "gl_PrimitivePointIndicesEXT";
	case BuiltInCullPrimitiveEXT:
		return "gl_CullPrimitiveEXT";

	default:
		return join("gl_BuiltIn_", convert_to_string(builtin));
	}
}